

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::ColoredWriteToStdout(LogSeverity severity,char *message,size_t len)

{
  undefined8 *puVar1;
  
  if ((int)severity < fLI::FLAGS_stderrthreshold) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  ColoredWriteToStderrOrStdout((FILE *)*puVar1,severity,message,len);
  return;
}

Assistant:

static void ColoredWriteToStdout(LogSeverity severity, const char* message,
                                 size_t len) {
  FILE* output = stdout;
  // We also need to send logs to the stderr when the severity is
  // higher or equal to the stderr threshold.
  if (severity >= FLAGS_stderrthreshold) {
    output = stderr;
  }
  ColoredWriteToStderrOrStdout(output, severity, message, len);
}